

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O1

void __thiscall aggreports::NormalisePeriodWeights(aggreports *this)

{
  int iVar1;
  _Rb_tree_node_base *p_Var2;
  _Rb_tree_header *p_Var3;
  
  iVar1 = this->samplesize_;
  if (iVar1 != 0) {
    p_Var2 = (this->periodstoweighting_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var3 = &(this->periodstoweighting_)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var2 != p_Var3) {
      do {
        p_Var2[1]._M_parent = (_Base_ptr)((double)p_Var2[1]._M_parent / (double)iVar1);
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
      } while ((_Rb_tree_header *)p_Var2 != p_Var3);
    }
  }
  return;
}

Assistant:

void aggreports::NormalisePeriodWeights() {

  if (samplesize_) {
    for (auto iter = periodstoweighting_.begin();
	 iter != periodstoweighting_.end(); ++iter) {
      iter->second /= samplesize_;
    }
  }

}